

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint getNumColorChannels(LodePNGColorType colortype)

{
  uint uVar1;
  
  switch(colortype) {
  case LCT_GREY:
  case LCT_PALETTE:
    uVar1 = 1;
    break;
  default:
    return 0;
  case LCT_RGB:
    uVar1 = 3;
    break;
  case LCT_GREY_ALPHA:
    uVar1 = 2;
    break;
  case LCT_RGBA:
    uVar1 = 4;
  }
  return uVar1;
}

Assistant:

static unsigned getNumColorChannels(LodePNGColorType colortype) {
  switch(colortype) {
    case LCT_GREY: return 1;
    case LCT_RGB: return 3;
    case LCT_PALETTE: return 1;
    case LCT_GREY_ALPHA: return 2;
    case LCT_RGBA: return 4;
    case LCT_MAX_OCTET_VALUE: return 0; /* invalid color type */
    default: return 0; /*invalid color type*/
  }
}